

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_hasIndirectEquivalentVariable_Test::Variable_hasIndirectEquivalentVariable_Test
          (Variable_hasIndirectEquivalentVariable_Test *this)

{
  Variable_hasIndirectEquivalentVariable_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Variable_hasIndirectEquivalentVariable_Test_0015ac70;
  return;
}

Assistant:

TEST(Variable, hasIndirectEquivalentVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();

    EXPECT_FALSE(v1->hasEquivalentVariable(v1, true));
    EXPECT_FALSE(v1->hasEquivalentVariable(v2, true));
    EXPECT_FALSE(v1->hasEquivalentVariable(v3, true));

    EXPECT_FALSE(v2->hasEquivalentVariable(v1, true));
    EXPECT_FALSE(v2->hasEquivalentVariable(v2, true));
    EXPECT_FALSE(v2->hasEquivalentVariable(v3, true));

    EXPECT_FALSE(v3->hasEquivalentVariable(v1, true));
    EXPECT_FALSE(v3->hasEquivalentVariable(v2, true));
    EXPECT_FALSE(v3->hasEquivalentVariable(v3, true));

    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v3);

    EXPECT_FALSE(v1->hasEquivalentVariable(v1, true));
    EXPECT_TRUE(v1->hasEquivalentVariable(v2, true));
    EXPECT_TRUE(v1->hasEquivalentVariable(v3, true));

    EXPECT_TRUE(v2->hasEquivalentVariable(v1, true));
    EXPECT_FALSE(v2->hasEquivalentVariable(v2, true));
    EXPECT_TRUE(v2->hasEquivalentVariable(v3, true));

    EXPECT_TRUE(v3->hasEquivalentVariable(v1, true));
    EXPECT_TRUE(v3->hasEquivalentVariable(v2, true));
    EXPECT_FALSE(v3->hasEquivalentVariable(v3, true));
}